

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosMath.cpp
# Opt level: O0

void adios2::helper::CalculateSubblockInfo(Dims *count,BlockDivisionInfo *info)

{
  ushort uVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  int j_1;
  uint16_t d;
  int j;
  uint16_t n;
  int ndim;
  int local_28;
  value_type local_22;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar6;
  undefined2 in_stack_ffffffffffffffe4;
  undefined2 in_stack_ffffffffffffffe6;
  short sVar7;
  ushort in_stack_ffffffffffffffe8;
  undefined2 uVar8;
  
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDI);
  local_28 = (int)sVar3;
  uVar8 = 0;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (in_RSI,CONCAT44(local_28,(uint)in_stack_ffffffffffffffe8),
             (value_type_conflict8 *)
             CONCAT26(in_stack_ffffffffffffffe6,
                      CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)));
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (in_RSI,(ulong)CONCAT42(local_28,uVar8) << 0x10,
             (value_type_conflict8 *)
             CONCAT26(in_stack_ffffffffffffffe6,
                      CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)));
  sVar7 = 1;
  for (iVar6 = 0; iVar6 < local_28; iVar6 = iVar6 + 1) {
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_RDI,(long)iVar6);
    uVar2 = *pvVar4;
    pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       (in_RSI,(long)iVar6);
    uVar1 = *pvVar5;
    pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       (in_RSI + 1,(long)iVar6);
    *pvVar5 = (value_type)(uVar2 % (ulong)uVar1);
    pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       (in_RSI,(long)iVar6);
    sVar7 = sVar7 * *pvVar5;
  }
  *(short *)&in_RSI[3].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish = sVar7;
  local_22 = 1;
  while (local_28 = local_28 + -1, -1 < local_28) {
    pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       (in_RSI + 2,(long)local_28);
    *pvVar5 = local_22;
    pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       (in_RSI,(long)local_28);
    local_22 = local_22 * *pvVar5;
  }
  return;
}

Assistant:

void CalculateSubblockInfo(const Dims &count, BlockDivisionInfo &info) noexcept
{
    const int ndim = static_cast<int>(count.size());
    info.Rem.resize(ndim, 0);
    info.ReverseDivProduct.resize(ndim, 0);
    uint16_t n = 1;
    // remainders + nBlocks calculation
    for (int j = 0; j < ndim; ++j)
    {
        info.Rem[j] = count[j] % info.Div[j];
        n = n * info.Div[j];
    }
    info.NBlocks = n;

    // division vector for calculating N-dim blockIDs from blockID
    uint16_t d = 1; // div[n-2] * div[n-3] * ... div[0]
    for (int j = ndim - 1; j >= 0; --j)
    {
        info.ReverseDivProduct[j] = d;
        d = d * info.Div[j];
    }
}